

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

istream * __thiscall nivalis::Environment::from_bin(Environment *this,istream *is)

{
  size_type __new_size;
  pointer pUVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  size_t sz;
  size_type local_30;
  
  std::istream::read((char *)is,(long)&local_30);
  std::vector<double,_std::allocator<double>_>::resize(&this->vars,local_30);
  pdVar2 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish == pdVar2) {
    __new_size = 0;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::istream::read((char *)is,(long)pdVar2 + lVar4);
      uVar3 = uVar3 + 1;
      pdVar2 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      __new_size = (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
      lVar4 = lVar4 + 8;
    } while (uVar3 < __new_size);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->varname,__new_size);
  std::istream::read((char *)is,(long)&local_30);
  std::
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>::
  resize(&this->funcs,local_30);
  pUVar1 = (this->funcs).
           super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->funcs).
      super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar1) {
    lVar4 = 0x50;
    uVar3 = 0;
    do {
      Expr::from_bin((Expr *)((long)pUVar1 + lVar4 + -0x30),is);
      std::istream::read((char *)is,
                         (long)&(((this->funcs).
                                  super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                         + lVar4);
      uVar3 = uVar3 + 1;
      pUVar1 = (this->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x58;
    } while (uVar3 < (ulong)(((long)(this->funcs).
                                    super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 3)
                            * 0x2e8ba2e8ba2e8ba3));
  }
  return is;
}

Assistant:

std::istream& Environment::from_bin(std::istream& is) {
    util::resize_from_read_bin(is, vars);
    for (size_t i = 0; i < vars.size(); ++i) {
        util::read_bin(is, vars[i]);
    }
    varname.resize(vars.size());
    util::resize_from_read_bin(is, funcs);
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].expr.from_bin(is);
        util::read_bin(is, funcs[i].n_args);
    }
    return is;
}